

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> * __thiscall
dg::llvmdg::legacy::GraphBuilder::getCalledFunctions(GraphBuilder *this,Value *v)

{
  initializer_list<const_llvm::Function_*> __l;
  ret_type pFVar1;
  allocator_type *in_RSI;
  Value *in_RDI;
  LLVMPointerAnalysis *unaff_retaddr;
  Value *in_stack_00000008;
  Function *F;
  Value *pVVar2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_ffffffffffffffc0
  ;
  undefined1 *puVar3;
  
  pVVar2 = in_RDI;
  pFVar1 = llvm::dyn_cast<llvm::Function,llvm::Value_const>(in_RDI);
  if (pFVar1 == (ret_type)0x0) {
    if (*(long *)in_RSI == 0) {
      memset(in_RDI,0,0x18);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x21d50f
                );
    }
    else {
      dg::getCalledFunctions(in_stack_00000008,unaff_retaddr);
    }
  }
  else {
    puVar3 = &stack0xffffffffffffffc8;
    std::allocator<const_llvm::Function_*>::allocator((allocator<const_llvm::Function_*> *)0x21d4c7)
    ;
    __l._M_len = (size_type)puVar3;
    __l._M_array = (iterator)pFVar1;
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
              (in_stack_ffffffffffffffc0,__l,in_RSI);
    std::allocator<const_llvm::Function_*>::~allocator
              ((allocator<const_llvm::Function_*> *)0x21d4e9);
  }
  return (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)pVVar2;
}

Assistant:

std::vector<const llvm::Function *>
GraphBuilder::getCalledFunctions(const llvm::Value *v) {
    if (const auto *F = llvm::dyn_cast<llvm::Function>(v)) {
        return {F};
    }

    if (!pointsToAnalysis_)
        return {};

    return dg::getCalledFunctions(v, pointsToAnalysis_);
}